

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall arangodb::velocypack::Parser::parseString(Parser *this)

{
  ValueLength *pVVar1;
  ValueLength VVar2;
  ValueLength VVar3;
  uint8_t *puVar4;
  uint uVar5;
  bool bVar6;
  undefined **ppuVar7;
  long lVar8;
  Builder *pBVar9;
  ulong uVar10;
  Exception *this_00;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  char *msg;
  int iVar14;
  ExceptionType type;
  int iVar15;
  byte bVar16;
  uint uVar17;
  ulong len;
  
  pBVar9 = this->_builderPtr;
  VVar2 = pBVar9->_pos;
  Builder::reserve(pBVar9,1);
  VVar3 = pBVar9->_pos;
  pBVar9->_pos = VVar3 + 1;
  pBVar9->_start[VVar3] = '@';
  pVVar1 = &pBVar9->_bufferPtr->_size;
  *pVVar1 = *pVVar1 + 1;
  uVar5 = 0;
  bVar6 = false;
LAB_00112863:
  uVar10 = this->_size;
  uVar13 = this->_pos;
  len = uVar10 - uVar13;
  if (0xf < len) {
    Builder::reserve(this->_builderPtr,len);
    ppuVar7 = &JSONStringCopy;
    if (this->options->validateUtf8Strings != false) {
      ppuVar7 = &JSONStringCopyCheckUtf8;
    }
    lVar8 = (*(code *)*ppuVar7)(this->_builderPtr->_start + this->_builderPtr->_pos,
                                this->_start + this->_pos,len - 0xf);
    uVar13 = this->_pos + lVar8;
    this->_pos = uVar13;
    pBVar9 = this->_builderPtr;
    pVVar1 = &pBVar9->_pos;
    *pVVar1 = *pVVar1 + lVar8;
    pVVar1 = &pBVar9->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + lVar8;
    uVar10 = this->_size;
  }
  if (uVar10 <= uVar13) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Unfinished string";
LAB_00112ed8:
    type = ParseError;
    goto LAB_00112ee0;
  }
  this->_pos = uVar13 + 1;
  bVar16 = this->_start[uVar13];
  uVar17 = (uint)bVar16;
  if ((!bVar6) && (0x7e < this->_builderPtr->_pos - (VVar2 + 1))) {
    Builder::reserve(this->_builderPtr,8);
    puVar4 = this->_builderPtr->_start;
    memmove(puVar4 + VVar2 + 9,puVar4 + VVar2 + 1,this->_builderPtr->_pos - (VVar2 + 1));
    pBVar9 = this->_builderPtr;
    pVVar1 = &pBVar9->_pos;
    *pVVar1 = *pVVar1 + 8;
    pVVar1 = &pBVar9->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + 8;
    bVar6 = true;
  }
  if (bVar16 == 0x5c) {
    uVar10 = this->_pos;
    if (this->_size <= uVar10) {
switchD_001129d7_caseD_6f:
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Invalid escape sequence";
      goto LAB_00112ed8;
    }
    this->_pos = uVar10 + 1;
    bVar16 = this->_start[uVar10];
    uVar17 = (uint)bVar16;
    if (bVar16 < 0x62) {
      if (((bVar16 == 0x22) || (bVar16 == 0x2f)) || (bVar16 == 0x5c)) goto LAB_00112b5c;
      goto switchD_001129d7_caseD_6f;
    }
    switch(bVar16) {
    case 0x6e:
      pBVar9 = this->_builderPtr;
      Builder::reserve(pBVar9,1);
      bVar16 = 10;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
      goto switchD_001129d7_caseD_6f;
    case 0x72:
      pBVar9 = this->_builderPtr;
      Builder::reserve(pBVar9,1);
      bVar16 = 0xd;
      break;
    case 0x74:
      pBVar9 = this->_builderPtr;
      Builder::reserve(pBVar9,1);
      bVar16 = 9;
      break;
    case 0x75:
      uVar17 = 0;
      iVar14 = 4;
      uVar10 = uVar10 + 1;
      do {
        if (this->_size <= uVar10) {
          this_00 = (Exception *)__cxa_allocate_exception(0x18);
          msg = "Unfinished \\uXXXX escape sequence";
          goto LAB_00112ed8;
        }
        this->_pos = uVar10 + 1;
        bVar16 = this->_start[uVar10];
        iVar15 = -0x30;
        if (((9 < bVar16 - 0x30) && (iVar15 = -0x57, 5 < bVar16 - 0x61)) &&
           (iVar15 = -0x37, 5 < bVar16 - 0x41)) {
          this_00 = (Exception *)__cxa_allocate_exception(0x18);
          msg = "Illegal \\uXXXX escape sequence character";
          goto LAB_00112ed8;
        }
        uVar17 = uVar17 * 0x10 + iVar15 + (uint)bVar16;
        iVar14 = iVar14 + -1;
        uVar10 = uVar10 + 1;
      } while (iVar14 != 0);
      if (uVar17 < 0x80) goto LAB_00112b5c;
      bVar16 = (byte)uVar17;
      if (uVar17 < 0x800) {
        Builder::reserve(this->_builderPtr,2);
        pBVar9 = this->_builderPtr;
        bVar11 = (byte)(uVar17 >> 6) | 0xc0;
LAB_00112c6e:
        VVar3 = pBVar9->_pos;
        pBVar9->_pos = VVar3 + 1;
        pBVar9->_start[VVar3] = bVar11;
        pVVar1 = &pBVar9->_bufferPtr->_size;
        *pVVar1 = *pVVar1 + 1;
        pBVar9 = this->_builderPtr;
        bVar16 = bVar16 & 0x3f | 0x80;
        break;
      }
      if ((uVar17 & 0xfffffc00) == 0xd800) {
        if (uVar5 != 0) {
          if (this->options->validateUtf8Strings != true) goto LAB_00112b89;
          this_00 = (Exception *)__cxa_allocate_exception(0x18);
          msg = "Unexpected \\uXXXX escape sequence (multiple adjacent high surrogates)";
          goto LAB_00112f0f;
        }
        Builder::reserve(this->_builderPtr,3);
        bVar11 = 0x2f;
        bVar12 = 0xed;
        uVar5 = uVar17;
LAB_00112d5c:
        pBVar9 = this->_builderPtr;
        VVar3 = pBVar9->_pos;
        pBVar9->_pos = VVar3 + 1;
        pBVar9->_start[VVar3] = bVar12;
        pVVar1 = &pBVar9->_bufferPtr->_size;
        *pVVar1 = *pVVar1 + 1;
        pBVar9 = this->_builderPtr;
        VVar3 = pBVar9->_pos;
        pBVar9->_pos = VVar3 + 1;
        pBVar9->_start[VVar3] = (byte)(uVar17 >> 6) & bVar11 | 0x80;
        pVVar1 = &pBVar9->_bufferPtr->_size;
        *pVVar1 = *pVVar1 + 1;
        pBVar9 = this->_builderPtr;
        VVar3 = pBVar9->_pos;
        pBVar9->_pos = VVar3 + 1;
        pBVar9->_start[VVar3] = bVar16 & 0x3f | 0x80;
        pVVar1 = &pBVar9->_bufferPtr->_size;
        *pVVar1 = *pVVar1 + 1;
      }
      else {
        if ((uVar17 & 0xfffffc00) != 0xdc00) {
          Builder::reserve(this->_builderPtr,3);
          pBVar9 = this->_builderPtr;
          VVar3 = pBVar9->_pos;
          pBVar9->_pos = VVar3 + 1;
          pBVar9->_start[VVar3] = (char)(uVar17 >> 0xc) + 0xe0;
          pVVar1 = &pBVar9->_bufferPtr->_size;
          *pVVar1 = *pVVar1 + 1;
          pBVar9 = this->_builderPtr;
          bVar11 = (byte)(uVar17 >> 6) & 0x3f | 0x80;
          goto LAB_00112c6e;
        }
        if (uVar5 != 0) {
          uVar17 = uVar5 * 0x400 + uVar17 + 0xfca02400;
          pBVar9 = this->_builderPtr;
          pBVar9->_pos = pBVar9->_pos - 3;
          pVVar1 = &pBVar9->_bufferPtr->_size;
          *pVVar1 = *pVVar1 - 3;
          Builder::reserve(pBVar9,4);
          pBVar9 = this->_builderPtr;
          VVar3 = pBVar9->_pos;
          pBVar9->_pos = VVar3 + 1;
          pBVar9->_start[VVar3] = (char)(uVar17 >> 0x12) + 0xf0;
          pVVar1 = &pBVar9->_bufferPtr->_size;
          *pVVar1 = *pVVar1 + 1;
          bVar12 = (byte)(uVar17 >> 0xc) & 0x3f | 0x80;
          bVar11 = 0x3f;
          uVar5 = 0;
          goto LAB_00112d5c;
        }
        uVar5 = 0;
        if (this->options->validateUtf8Strings == true) {
          this_00 = (Exception *)__cxa_allocate_exception(0x18);
          msg = "Unexpected \\uXXXX escape sequence (low surrogate without high surrogate)";
LAB_00112f0f:
          type = InvalidUtf8Sequence;
LAB_00112ee0:
          Exception::Exception(this_00,type,msg);
LAB_00112ee5:
          __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
        }
      }
      goto LAB_00112863;
    default:
      if (bVar16 == 0x62) {
        pBVar9 = this->_builderPtr;
        Builder::reserve(pBVar9,1);
        bVar16 = 8;
      }
      else {
        if (bVar16 != 0x66) goto switchD_001129d7_caseD_6f;
        pBVar9 = this->_builderPtr;
        Builder::reserve(pBVar9,1);
        bVar16 = 0xc;
      }
    }
LAB_00112b6d:
    VVar3 = pBVar9->_pos;
    pBVar9->_pos = VVar3 + 1;
    pBVar9->_start[VVar3] = bVar16;
    pVVar1 = &pBVar9->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + 1;
LAB_00112b89:
    if ((this->options->validateUtf8Strings != true) || (uVar5 == 0)) goto LAB_00112863;
    parseString();
  }
  else {
    if (bVar16 == 0x22) {
      pBVar9 = this->_builderPtr;
      if (bVar6) {
        uVar10 = (pBVar9->_pos - VVar2) - 9;
        pBVar9->_start[VVar2] = 0xbf;
        lVar8 = 0;
        do {
          this->_builderPtr->_start[lVar8 + 1 + VVar2] = (uint8_t)uVar10;
          uVar10 = uVar10 >> 8;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
      }
      else {
        pBVar9->_start[VVar2] = (char)pBVar9->_pos + ~(byte)VVar2 + '@';
      }
      if ((this->options->validateUtf8Strings != true) || (uVar5 == 0)) {
        return;
      }
LAB_00112e4b:
      parseString();
LAB_00112e50:
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      Exception::Exception(this_00,InvalidUtf8Sequence);
      goto LAB_00112ee5;
    }
    if ((char)bVar16 < '\0') {
      if (this->options->validateUtf8Strings == false) {
LAB_00112b5c:
        bVar16 = (byte)uVar17;
        pBVar9 = this->_builderPtr;
        Builder::reserve(pBVar9,1);
        goto LAB_00112b6d;
      }
      iVar14 = 1;
      if (((bVar16 & 0xe0) == 0xc0) ||
         (((bVar16 & 0xe0) != 0x80 &&
          ((iVar14 = 2, (bVar16 & 0xf0) == 0xe0 || (iVar14 = 3, (bVar16 & 0xf8) == 0xf0)))))) {
        Builder::reserve(this->_builderPtr,(ulong)(iVar14 + 1));
        pBVar9 = this->_builderPtr;
        VVar2 = pBVar9->_pos;
        pBVar9->_pos = VVar2 + 1;
        pBVar9->_start[VVar2] = bVar16;
        pVVar1 = &pBVar9->_bufferPtr->_size;
        *pVVar1 = *pVVar1 + 1;
        if (this->_size <= this->_pos) {
          this_00 = (Exception *)__cxa_allocate_exception(0x18);
          msg = "scanString: truncated UTF-8 sequence";
          goto LAB_00112ed8;
        }
        this->_pos = this->_pos + 1;
      }
      goto LAB_00112e50;
    }
    if (0x1f < bVar16) goto LAB_00112b5c;
  }
  parseString();
  goto LAB_00112e4b;
}

Assistant:

void Parser::parseString() {
  // When we get here, we have seen a " character and now want to
  // find the end of the string and parse the string value to its
  // VPack representation. We assume that the string is short and
  // insert 8 bytes for the length as soon as we reach 127 bytes
  // in the VPack representation.
  ValueLength const base = _builderPtr->_pos;
  _builderPtr->appendByte(0x40);  // correct this later

  bool large = false;          // set to true when we reach 128 bytes
  uint32_t highSurrogate = 0;  // non-zero if high-surrogate was seen

  while (true) {
    std::size_t remainder = _size - _pos;
    if (remainder >= 16) {
      _builderPtr->reserve(remainder);
      std::size_t count;
      // Note that the SSE4.2 accelerated string copying functions might
      // peek up to 15 bytes over the given end, because they use 128bit
      // registers. Therefore, we have to subtract 15 from remainder
      // to be on the safe side. Further bytes will be processed below.
      if (options->validateUtf8Strings) {
        count = JSONStringCopyCheckUtf8(_builderPtr->_start + _builderPtr->_pos,
                                        _start + _pos, remainder - 15);
      } else {
        count = JSONStringCopy(_builderPtr->_start + _builderPtr->_pos,
                               _start + _pos, remainder - 15);
      }
      _pos += count;
      _builderPtr->advance(count);
    }
    int i = getOneOrThrow("Unfinished string");
    if (!large && _builderPtr->_pos - (base + 1) > 126) {
      large = true;
      _builderPtr->reserve(8);
      ValueLength len = _builderPtr->_pos - (base + 1);
      memmove(_builderPtr->_start + base + 9, _builderPtr->_start + base + 1,
              checkOverflow(len));
      _builderPtr->advance(8);
    }
    
    switch (i) {
      case '"':
        ValueLength len;
        if (!large) {
          len = _builderPtr->_pos - (base + 1);
          _builderPtr->_start[base] = 0x40 + static_cast<uint8_t>(len);
          // String is ready
        } else {
          len = _builderPtr->_pos - (base + 9);
          _builderPtr->_start[base] = 0xbf;
          for (ValueLength i = 1; i <= 8; i++) {
            _builderPtr->_start[base + i] = len & 0xff;
            len >>= 8;
          }
        }
        if (VELOCYPACK_UNLIKELY(options->validateUtf8Strings && highSurrogate != 0)) {
          throw Exception(Exception::InvalidUtf8Sequence,
                              "Unexpected end of string after high surrogate");
        }
        return;
      case '\\':
        // Handle cases or throw error
        i = consume();
        if (VELOCYPACK_UNLIKELY(i < 0)) {
          throw Exception(Exception::ParseError, "Invalid escape sequence");
        }
        switch (i) {
          case '"':
          case '/':
          case '\\':
            _builderPtr->appendByte(static_cast<uint8_t>(i));
            break;
          case 'b':
            _builderPtr->appendByte('\b');
            break;
          case 'f':
            _builderPtr->appendByte('\f');
            break;
          case 'n':
            _builderPtr->appendByte('\n');
            break;
          case 'r':
            _builderPtr->appendByte('\r');
            break;
          case 't':
            _builderPtr->appendByte('\t');
            break;
          case 'u': {
            uint32_t v = 0;
            for (int j = 0; j < 4; j++) {
              i = consume();
              if (i < 0) {
                throw Exception(Exception::ParseError,
                                "Unfinished \\uXXXX escape sequence");
              }
              if (i >= '0' && i <= '9') {
                v = (v << 4) + i - '0';
              } else if (i >= 'a' && i <= 'f') {
                v = (v << 4) + i - 'a' + 10;
              } else if (i >= 'A' && i <= 'F') {
                v = (v << 4) + i - 'A' + 10;
              } else {
                throw Exception(Exception::ParseError,
                                "Illegal \\uXXXX escape sequence character");
              }
            }
            if (v < 0x80) {
              _builderPtr->appendByte(static_cast<uint8_t>(v));
            } else if (v < 0x800) {
              _builderPtr->reserve(2);
              _builderPtr->appendByteUnchecked(0xc0 + (v >> 6));
              _builderPtr->appendByteUnchecked(0x80 + (v & 0x3f));
            } else if (v >= 0xdc00 && v < 0xe000) {
              if (highSurrogate != 0) {
                // Low surrogate, put the two together:
                v = 0x10000 + ((highSurrogate - 0xd800) << 10) + v - 0xdc00;
                _builderPtr->rollback(3);
                _builderPtr->reserve(4);
                _builderPtr->appendByteUnchecked(0xf0 + (v >> 18));
                _builderPtr->appendByteUnchecked(0x80 + ((v >> 12) & 0x3f));
                _builderPtr->appendByteUnchecked(0x80 + ((v >> 6) & 0x3f));
                _builderPtr->appendByteUnchecked(0x80 + (v & 0x3f));
                highSurrogate = 0;
              } else if (options->validateUtf8Strings) {
                // Low surrogate without a high surrogate first
                throw Exception(Exception::InvalidUtf8Sequence,
                                "Unexpected \\uXXXX escape sequence (low surrogate without high surrogate)");
              }
            } else if (v >= 0xd800 && v < 0xdc00) {
              if (highSurrogate == 0) {
                // High surrogate:
                highSurrogate = v;
                _builderPtr->reserve(3);
                _builderPtr->appendByteUnchecked(0xe0 + (v >> 12));
                _builderPtr->appendByteUnchecked(0x80 + ((v >> 6) & 0x3f));
                _builderPtr->appendByteUnchecked(0x80 + (v & 0x3f));

                continue;
              } else if (options->validateUtf8Strings) {
                throw Exception(Exception::InvalidUtf8Sequence,
                                "Unexpected \\uXXXX escape sequence (multiple adjacent high surrogates)");
              }
            } else {
              _builderPtr->reserve(3);
              _builderPtr->appendByteUnchecked(0xe0 + (v >> 12));
              _builderPtr->appendByteUnchecked(0x80 + ((v >> 6) & 0x3f));
              _builderPtr->appendByteUnchecked(0x80 + (v & 0x3f));
            }
            break;
          }
          default:
            throw Exception(Exception::ParseError, "Invalid escape sequence");
        }
        break;
      default:
        if ((i & 0x80) == 0) {
          // non-UTF-8 sequence
          if (VELOCYPACK_UNLIKELY(i < 0x20)) {
            // control character
            throw Exception(Exception::UnexpectedControlCharacter);
          }
          _builderPtr->appendByte(static_cast<uint8_t>(i));
        } else {
          if (!options->validateUtf8Strings) {
            _builderPtr->appendByte(static_cast<uint8_t>(i));
          } else {
            // multi-byte UTF-8 sequence!
            int follow = 0;
            if ((i & 0xe0) == 0x80) {
              throw Exception(Exception::InvalidUtf8Sequence);
            } else if ((i & 0xe0) == 0xc0) {
              // two-byte sequence
              follow = 1;
            } else if ((i & 0xf0) == 0xe0) {
              // three-byte sequence
              follow = 2;
            } else if ((i & 0xf8) == 0xf0) {
              // four-byte sequence
              follow = 3;
            } else {
              throw Exception(Exception::InvalidUtf8Sequence);
            }

            // validate follow up characters
            _builderPtr->reserve(1 + follow);
            _builderPtr->appendByteUnchecked(static_cast<uint8_t>(i));
            for (int j = 0; j < follow; ++j) {
              i = getOneOrThrow("scanString: truncated UTF-8 sequence");
              if ((i & 0xc0) != 0x80) {
                throw Exception(Exception::InvalidUtf8Sequence);
              }
              _builderPtr->appendByteUnchecked(static_cast<uint8_t>(i));
            }
          }
        }
        break;
    }

    if (VELOCYPACK_UNLIKELY(options->validateUtf8Strings && highSurrogate != 0)) {
      throw Exception(Exception::InvalidUtf8Sequence,
                      "Unexpected \\uXXXX escape sequence (high surrogate without low surrogate)");
    }
  }
}